

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_typerestr(lyout *out,int level,lys_module *module,lys_restr *restr,char *elem_name)

{
  bool bVar1;
  char *local_58;
  int local_34;
  int pattern;
  int content;
  char *elem_name_local;
  lys_restr *restr_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  local_34 = 0;
  bVar1 = false;
  if ((*restr->expr == '\x06') || (*restr->expr == '\x15')) {
    bVar1 = true;
  }
  if (bVar1) {
    local_58 = restr->expr + 1;
  }
  else {
    local_58 = restr->expr;
  }
  _pattern = elem_name;
  elem_name_local = (char *)restr;
  restr_local = (lys_restr *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  yin_print_open(out,level,(char *)0x0,elem_name,"value",local_58,0);
  yin_print_restr(plStack_10,module_local._4_4_ + 1,(lys_module *)restr_local,
                  (lys_restr *)elem_name_local,&local_34);
  yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,_pattern,local_34);
  return;
}

Assistant:

static void
yin_print_typerestr(struct lyout *out, int level, const struct lys_module *module,
                    const struct lys_restr *restr, const char *elem_name)
{
    int content = 0;
    int pattern = 0;

    if (restr->expr[0] == 0x06 || restr->expr[0] == 0x15) {
        pattern = 1;
    }

    yin_print_open(out, level, NULL, elem_name, "value", pattern ? &restr->expr[1] : restr->expr , content);
    yin_print_restr(out, level + 1, module, restr, &content);
    yin_print_close(out, level, NULL, elem_name, content);
}